

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O0

Image * Image_Function_Helper::Rotate
                  (RotateForm4 rotate,Image *in,double centerX,double centerY,double angle)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ImageTemplate<unsigned_char> *in_RDX;
  code *in_RSI;
  Image *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  Image *out;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  ImageTemplate<unsigned_char> *pIVar3;
  uint32_t in_stack_ffffffffffffff80;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff88;
  undefined2 uVar4;
  
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  Image_Function::VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  pIVar3 = in_RDX;
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RDX);
  uVar4 = (undefined2)((ulong)pIVar3 >> 0x30);
  PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RDX);
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            (in_stack_ffffffffffffff88,uVar1,in_stack_ffffffffffffff80,(uint8_t)((ushort)uVar4 >> 8)
             ,(uint8_t)uVar4);
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RDX);
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RDX);
  (*in_RSI)(in_XMM0_Qa,in_XMM1_Qa,in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa,in_RDX,0,0,in_RDI,0,0,uVar1,uVar2
           );
  return in_RDI;
}

Assistant:

Image Rotate( FunctionTable::RotateForm4 rotate,
                  const Image & in, double centerX, double centerY, double angle )
    {
        Image_Function::ParameterValidation( in );
        Image_Function::VerifyGrayScaleImage( in );
        Image out = in.generate( in.width(), in.height() );

        rotate( in, 0, 0, centerX, centerY, out, 0, 0, centerX, centerY, in.width(), in.height(), angle );

        return out;
    }